

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  undefined8 in_RCX;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  
  iVar1 = strcmp(in_R8,"0.11.0");
  if ((iVar1 == 0) && (iVar1 = strncmp(in_R9,"cv-gm*uh",8), iVar1 == 0)) {
    sexp_define_foreign_aux
              (in_RDI,in_RCX,"current-clock-second",0,0,"sexp_current_clock_second",
               sexp_current_clock_second,0);
    return (sexp_conflict)0x43e;
  }
  return *(sexp_conflict *)(*(long *)(in_RDI + 0x28) + 0x48);
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return sexp_global(ctx, SEXP_G_ABI_ERROR);
  sexp_define_foreign(ctx, env, "current-clock-second", 0, sexp_current_clock_second);
#if SEXP_USE_NTP_GETTIME
  determine_ntp_resolution();
  sexp_define_foreign(ctx, env, "current-ntp-clock-values", 0, sexp_current_ntp_clock_values);
#endif
  return SEXP_VOID;
}